

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void __thiscall RVO::Agent::insertObstacleNeighbor(Agent *this,Obstacle *obstacle,float rangeSq)

{
  bool bVar1;
  float fVar2;
  size_type sVar3;
  reference pvVar4;
  reference this_00;
  pair<float,_const_RVO::Obstacle_*> pVar5;
  pair<float,_const_RVO::Obstacle_*> local_58;
  size_type local_48;
  size_t i;
  Obstacle *local_38;
  float local_2c;
  Obstacle *pOStack_28;
  float distSq;
  Obstacle *nextObstacle;
  Obstacle *pOStack_18;
  float rangeSq_local;
  Obstacle *obstacle_local;
  Agent *this_local;
  
  pOStack_28 = obstacle->nextObstacle_;
  nextObstacle._4_4_ = rangeSq;
  pOStack_18 = obstacle;
  obstacle_local = (Obstacle *)this;
  local_2c = distSqPointLineSegment(&obstacle->point_,&pOStack_28->point_,&this->position_);
  if (local_2c < nextObstacle._4_4_) {
    pVar5 = std::make_pair<float_const&,RVO::Obstacle_const*&>(&local_2c,&stack0xffffffffffffffe8);
    local_38 = pVar5.second;
    i._0_4_ = pVar5.first;
    std::
    vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
    ::push_back(&this->obstacleNeighbors_,(value_type *)&i);
    sVar3 = std::
            vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
            ::size(&this->obstacleNeighbors_);
    while( true ) {
      fVar2 = local_2c;
      local_48 = sVar3 - 1;
      bVar1 = false;
      if (local_48 != 0) {
        pvVar4 = std::
                 vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                 ::operator[](&this->obstacleNeighbors_,sVar3 - 2);
        bVar1 = fVar2 < pvVar4->first;
      }
      if (!bVar1) break;
      pvVar4 = std::
               vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
               ::operator[](&this->obstacleNeighbors_,local_48 - 1);
      this_00 = std::
                vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                ::operator[](&this->obstacleNeighbors_,local_48);
      std::pair<float,_const_RVO::Obstacle_*>::operator=(this_00,pvVar4);
      sVar3 = local_48;
    }
    pVar5 = std::make_pair<float_const&,RVO::Obstacle_const*&>(&local_2c,&stack0xffffffffffffffe8);
    local_58.second = pVar5.second;
    local_58.first = pVar5.first;
    pvVar4 = std::
             vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
             ::operator[](&this->obstacleNeighbors_,local_48);
    std::pair<float,_const_RVO::Obstacle_*>::operator=(pvVar4,&local_58);
  }
  return;
}

Assistant:

void Agent::insertObstacleNeighbor(const Obstacle *obstacle, float rangeSq)
	{
		const Obstacle *const nextObstacle = obstacle->nextObstacle_;

		const float distSq = distSqPointLineSegment(obstacle->point_, nextObstacle->point_, position_);

		if (distSq < rangeSq) {
			obstacleNeighbors_.push_back(std::make_pair(distSq, obstacle));

			size_t i = obstacleNeighbors_.size() - 1;

			while (i != 0 && distSq < obstacleNeighbors_[i - 1].first) {
				obstacleNeighbors_[i] = obstacleNeighbors_[i - 1];
				--i;
			}

			obstacleNeighbors_[i] = std::make_pair(distSq, obstacle);
		}
	}